

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

int32_t __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
DecodeHoleAndTopologySplitEvents
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          DecoderBuffer *decoder_buffer)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  reference pvVar4;
  int64_t iVar5;
  DecoderBuffer *in_RSI;
  uint *in_RDI;
  uint32_t delta_1;
  HoleEventData event_data_4;
  uint32_t i_4;
  int last_symbol_id;
  HoleEventData event_data_3;
  uint32_t i_3;
  uint32_t num_hole_events;
  TopologySplitEventData *event_data_2;
  uint32_t edge_data_1;
  uint32_t i_2;
  uint32_t delta;
  TopologySplitEventData event_data_1;
  uint32_t i_1;
  int last_source_symbol_id;
  uint8_t edge_data;
  TopologySplitEventData event_data;
  uint32_t i;
  uint32_t num_topology_splits;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint32_t nbits;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  byte local_50;
  uint local_4c;
  uint local_48;
  uint local_38;
  uint local_34;
  uint local_20;
  uint local_1c;
  
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 2));
  if (uVar2 < 0x200) {
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
    if (!bVar1) {
      return -1;
    }
  }
  else {
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (DecoderBuffer *)0x172d12);
    if (!bVar1) {
      return -1;
    }
  }
  if (local_1c != 0) {
    in_stack_ffffffffffffff7c = local_1c;
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x172d49)
    ;
    uVar3 = CornerTable::num_faces((CornerTable *)0x172d51);
    if (uVar3 < in_stack_ffffffffffffff7c) {
      return -1;
    }
    uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 2));
    if (uVar2 < 0x102) {
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        bVar1 = DecoderBuffer::Decode<unsigned_int>
                          ((DecoderBuffer *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
        if (!bVar1) {
          return -1;
        }
        bVar1 = DecoderBuffer::Decode<unsigned_int>
                          ((DecoderBuffer *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
        if (!bVar1) {
          return -1;
        }
        bVar1 = DecoderBuffer::Decode<unsigned_char>
                          ((DecoderBuffer *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (uchar *)in_RDI);
        if (!bVar1) {
          return -1;
        }
        std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
        push_back((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                   *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
    }
    else {
      local_34 = 0;
      for (local_38 = 0; local_38 < local_1c; local_38 = local_38 + 1) {
        bVar1 = DecodeVarint<unsigned_int>
                          ((uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (DecoderBuffer *)0x172e78);
        if (!bVar1) {
          return -1;
        }
        local_34 = local_48 + local_34;
        bVar1 = DecodeVarint<unsigned_int>
                          ((uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (DecoderBuffer *)0x172ea7);
        if (!bVar1) {
          return -1;
        }
        if (local_34 < local_48) {
          return -1;
        }
        std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
        push_back((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                   *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      DecoderBuffer::StartBitDecoding
                ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 SUB41((uint)in_stack_ffffffffffffff94 >> 0x18,0),
                 (uint64_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      for (local_4c = 0; local_4c < local_1c; local_4c = local_4c + 1) {
        uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 2));
        nbits = (uint32_t)((ulong)in_RDI >> 0x20);
        if (uVar2 < 0x202) {
          DecoderBuffer::DecodeLeastSignificantBits32
                    ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     nbits,(uint32_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                    );
        }
        else {
          DecoderBuffer::DecodeLeastSignificantBits32
                    ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     nbits,(uint32_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                    );
        }
        pvVar4 = std::
                 vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ::operator[]((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                               *)(in_RDI + 0x12),(ulong)local_4c);
        pvVar4->field_0x8 = pvVar4->field_0x8 & 0xfe | local_50 & 1;
      }
      DecoderBuffer::EndBitDecoding
                ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
  }
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 2));
  if (uVar2 < 0x200) {
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
    if (!bVar1) {
      return -1;
    }
  }
  else {
    uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 2));
    if ((uVar2 < 0x201) &&
       (bVar1 = DecodeVarint<unsigned_int>
                          ((uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (DecoderBuffer *)0x173031), !bVar1)) {
      return -1;
    }
  }
  iVar5 = DecoderBuffer::decoded_size(in_RSI);
  return (int32_t)iVar5;
}

Assistant:

int32_t
MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeHoleAndTopologySplitEvents(
    DecoderBuffer *decoder_buffer) {
  // Prepare a new decoder from the provided buffer offset.
  uint32_t num_topology_splits;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_buffer->Decode(&num_topology_splits)) {
      return -1;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_topology_splits, decoder_buffer)) {
      return -1;
    }
  }
  if (num_topology_splits > 0) {
    if (num_topology_splits >
        static_cast<uint32_t>(corner_table_->num_faces())) {
      return -1;
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(1, 2)) {
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        TopologySplitEventData event_data;
        if (!decoder_buffer->Decode(&event_data.split_symbol_id)) {
          return -1;
        }
        if (!decoder_buffer->Decode(&event_data.source_symbol_id)) {
          return -1;
        }
        uint8_t edge_data;
        if (!decoder_buffer->Decode(&edge_data)) {
          return -1;
        }
        event_data.source_edge = edge_data & 1;
        topology_split_data_.push_back(event_data);
      }

    } else
#endif
    {
      // Decode source and split symbol ids using delta and varint coding. See
      // description in mesh_edgebreaker_encoder_impl.cc for more details.
      int last_source_symbol_id = 0;
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        TopologySplitEventData event_data;
        uint32_t delta;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        event_data.source_symbol_id = delta + last_source_symbol_id;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        if (delta > event_data.source_symbol_id) {
          return -1;
        }
        event_data.split_symbol_id =
            event_data.source_symbol_id - static_cast<int32_t>(delta);
        last_source_symbol_id = event_data.source_symbol_id;
        topology_split_data_.push_back(event_data);
      }
      // Split edges are decoded from a direct bit decoder.
      decoder_buffer->StartBitDecoding(false, nullptr);
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        uint32_t edge_data;
        if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
          decoder_buffer->DecodeLeastSignificantBits32(2, &edge_data);
        } else {
          decoder_buffer->DecodeLeastSignificantBits32(1, &edge_data);
        }
        TopologySplitEventData &event_data = topology_split_data_[i];
        event_data.source_edge = edge_data & 1;
      }
      decoder_buffer->EndBitDecoding();
    }
  }
  uint32_t num_hole_events = 0;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_buffer->Decode(&num_hole_events)) {
      return -1;
    }
  } else if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
    if (!DecodeVarint(&num_hole_events, decoder_buffer)) {
      return -1;
    }
  }
#endif
  if (num_hole_events > 0) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(1, 2)) {
      for (uint32_t i = 0; i < num_hole_events; ++i) {
        HoleEventData event_data;
        if (!decoder_buffer->Decode(&event_data)) {
          return -1;
        }
        hole_event_data_.push_back(event_data);
      }

    } else
#endif
    {
      // Decode hole symbol ids using delta and varint coding.
      int last_symbol_id = 0;
      for (uint32_t i = 0; i < num_hole_events; ++i) {
        HoleEventData event_data;
        uint32_t delta;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        event_data.symbol_id = delta + last_symbol_id;
        last_symbol_id = event_data.symbol_id;
        hole_event_data_.push_back(event_data);
      }
    }
  }
  return static_cast<int32_t>(decoder_buffer->decoded_size());
}